

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<unsigned_long,unsigned_int,long>
                   (char *fmt,unsigned_long *args,uint *args_1,long *args_2)

{
  ostream *in_RCX;
  string *in_RDI;
  char *in_R8;
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream *this;
  uint *in_stack_fffffffffffffe48;
  unsigned_long *in_stack_fffffffffffffe50;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  format<unsigned_long,unsigned_int,long>
            (in_RCX,in_R8,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(long *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}